

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O1

void Wlc_ObjSetCo(Wlc_Ntk_t *p,Wlc_Obj_t *pObj,int fFlopInput)

{
  ushort uVar1;
  
  Vec_IntPush(&p->vCos,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
  uVar1 = 0x400;
  if (fFlopInput == 0) {
    Vec_IntPush(&p->vPos,(int)((ulong)((long)pObj - (long)p->pObjs) >> 3) * -0x55555555);
    uVar1 = 0x200;
  }
  *(ushort *)pObj = *(ushort *)pObj | uVar1;
  return;
}

Assistant:

void Wlc_ObjSetCo( Wlc_Ntk_t * p, Wlc_Obj_t * pObj, int fFlopInput )
{
//    pObj->Fanins[1] = Vec_IntSize(&p->vCos);
    Vec_IntPush( &p->vCos, Wlc_ObjId(p, pObj) );
    if ( !fFlopInput )
        Vec_IntPush( &p->vPos, Wlc_ObjId(p, pObj) );
    if ( fFlopInput )
        pObj->fIsFi = 1;
    else
        pObj->fIsPo = 1;
}